

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * __thiscall
MakefileGenerator::createSedArgs
          (QString *__return_storage_ptr__,MakefileGenerator *this,ProKey *replace_rule,
          QString *file_name)

{
  long lVar1;
  QMakeProject *pQVar2;
  bool bVar3;
  ProStringList *pPVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_260;
  QArrayDataPointer<char16_t> local_248;
  QArrayDataPointer<char16_t> local_230;
  QArrayDataPointer<char16_t> local_218;
  QStringBuilder<const_char_(&)[3],_QString> local_1f8;
  QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]> local_1d8;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
  local_1a8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>,_const_char_(&)[4]>
  local_168;
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char16_t> local_108;
  QStringBuilder<const_char_(&)[5],_QString> local_e8;
  ProString filename;
  ProString replace;
  ProString match;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar3 = QMakeProject::isEmpty(this->project,replace_rule);
  if (!bVar3) {
    pQVar2 = this->project;
    QString::QString((QString *)&local_168,"no_sed_meta_install");
    bVar3 = QMakeProject::isActiveConfig(pQVar2,(QString *)&local_168,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    if (!bVar3) {
      pPVar4 = QMakeEvaluator::valuesRef(&this->project->super_QMakeEvaluator,replace_rule);
      lVar6 = 0;
      for (uVar5 = 0; uVar5 < (ulong)(pPVar4->super_QList<ProString>).d.size; uVar5 = uVar5 + 1) {
        match.m_file = -0x55555556;
        match._36_4_ = 0xaaaaaaaa;
        match.m_hash = 0xaaaaaaaaaaaaaaaa;
        match.m_string.d.size = -0x5555555555555556;
        match.m_offset = -0x55555556;
        match.m_length = -0x55555556;
        match.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        match.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        pQVar2 = this->project;
        local_1a8.a.a.a =
             (char (*) [3])((long)&(((pPVar4->super_QList<ProString>).d.ptr)->m_string).d.d + lVar6)
        ;
        local_1a8.a.a.b.d.d = (Data *)0x21b843;
        ProString::ProString<ProString_const&,char_const(&)[7]>
                  ((ProString *)&local_168,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_1a8);
        QMakeEvaluator::first(&match,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
        replace.m_file = -0x55555556;
        replace._36_4_ = 0xaaaaaaaa;
        replace.m_hash = 0xaaaaaaaaaaaaaaaa;
        replace.m_string.d.size = -0x5555555555555556;
        replace.m_offset = -0x55555556;
        replace.m_length = -0x55555556;
        replace.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        replace.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        pQVar2 = this->project;
        local_1a8.a.a.a =
             (char (*) [3])((long)&(((pPVar4->super_QList<ProString>).d.ptr)->m_string).d.d + lVar6)
        ;
        local_1a8.a.a.b.d.d = (Data *)0x21b84a;
        ProString::ProString<ProString_const&,char_const(&)[9]>
                  ((ProString *)&local_168,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&local_1a8);
        QMakeEvaluator::first(&replace,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
        filename.m_file = -0x55555556;
        filename._36_4_ = 0xaaaaaaaa;
        filename.m_hash = 0xaaaaaaaaaaaaaaaa;
        filename.m_string.d.size = -0x5555555555555556;
        filename.m_offset = -0x55555556;
        filename.m_length = -0x55555556;
        filename.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        filename.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        pQVar2 = this->project;
        local_1a8.a.a.a =
             (char (*) [3])((long)&(((pPVar4->super_QList<ProString>).d.ptr)->m_string).d.d + lVar6)
        ;
        local_1a8.a.a.b.d.d = (Data *)0x21b853;
        ProString::ProString<ProString_const&,char_const(&)[10]>
                  ((ProString *)&local_168,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)&local_1a8);
        QMakeEvaluator::first(&filename,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
        if ((match.m_length != 0) &&
           ((filename.m_length == 0 || (bVar3 = ProString::operator==(&filename,file_name), bVar3)))
           ) {
          local_168.a.a.a.a = (char (*) [3])0x21b862;
          local_168.a.a.a.b.d.d = (Data *)&match;
          local_168.a.a.a.b.d.ptr = L",";
          local_168.a.a.a.b.d.size = (qsizetype)&replace;
          local_168.a.a.b = (char (*) [2])0x21b865;
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_const_ProString_&>,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[3]>
          ::convertTo<QString>
                    ((QString *)&local_e8,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_const_ProString_&>,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[3]>
                      *)&local_168);
          shellQuote((QString *)&local_1d8,this,(QString *)&local_e8);
          local_1a8.a.a.b.d.size = (qsizetype)local_1d8.a.b.d.ptr;
          local_1a8.a.a.b.d.ptr = (char16_t *)local_1d8.a.b.d.d;
          local_1a8.a.a.b.d.d = (Data *)local_1d8.a.a;
          local_1a8.a.a.a = (char (*) [3])0x21b85d;
          local_1d8.a.a = (char (*) [3])0x0;
          local_1d8.a.b.d.d = (Data *)0x0;
          local_1d8.a.b.d.ptr = (char16_t *)0x0;
          ::operator+=(__return_storage_ptr__,
                       (QStringBuilder<const_char_(&)[5],_QString> *)&local_1a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8.a.a.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
          bVar3 = isWindowsShell(this);
          if (bVar3) {
            pQVar2 = this->project;
            local_1d8.a.a =
                 (char (*) [3])
                 ((long)&(((pPVar4->super_QList<ProString>).d.ptr)->m_string).d.d + lVar6);
            local_1d8.a.b.d.d = (Data *)0x2188d8;
            ProString::ProString<ProString_const&,char_const(&)[8]>
                      ((ProString *)&local_1a8,
                       (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_1d8);
            QMakeEvaluator::first
                      ((ProString *)&local_168,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_1a8);
            bVar3 = ProString::contains((ProString *)&local_168,"path",CaseSensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_168);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_1a8);
            if (bVar3) {
              ProString::toQString((QString *)&local_230,&match);
              windowsifyPath((QString *)&local_218,(QString *)&local_230);
              local_1f8.b.d.size = local_218.size;
              local_1f8.b.d.ptr = local_218.ptr;
              local_1f8.b.d.d = local_218.d;
              local_1f8.a = (char (*) [3])0x21b862;
              local_218.d = (Data *)0x0;
              local_218.ptr = (char16_t *)0x0;
              local_218.size = 0;
              QStringBuilder<const_char_(&)[3],_QString>::QStringBuilder(&local_1d8.a,&local_1f8);
              local_1d8.b = (char (*) [2])0x21cade;
              ProString::toQString((QString *)&local_260,&replace);
              windowsifyPath((QString *)&local_248,(QString *)&local_260);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
              ::QStringBuilder(&local_1a8,&local_1d8,(QString *)&local_248);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
              ::QStringBuilder(&local_168.a,&local_1a8);
              local_168.b = (char (*) [4])0x21b868;
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>,_const_char_(&)[4]>
              ::convertTo<QString>((QString *)&local_120,&local_168);
              shellQuote((QString *)&local_108,this,(QString *)&local_120);
              local_e8.b.d.size = local_108.size;
              local_e8.b.d.ptr = local_108.ptr;
              local_e8.b.d.d = local_108.d;
              local_e8.a = (char (*) [5])0x21b85d;
              local_108.d = (Data *)0x0;
              local_108.ptr = (char16_t *)0x0;
              local_108.size = 0;
              ::operator+=(__return_storage_ptr__,&local_e8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8.b.d);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
              ::~QStringBuilder(&local_168.a);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
              ::~QStringBuilder(&local_1a8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_248);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_260);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d8.a.b.d);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1f8.b.d);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_218);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_230);
            }
          }
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&filename);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&replace);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
        lVar6 = lVar6 + 0x30;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString MakefileGenerator::createSedArgs(const ProKey &replace_rule, const QString &file_name) const
{
    QString sedargs;
    if (!project->isEmpty(replace_rule) && !project->isActiveConfig("no_sed_meta_install")) {
        const ProStringList &replace_rules = project->values(replace_rule);
        for (int r = 0; r < replace_rules.size(); ++r) {
            const ProString match = project->first(ProKey(replace_rules.at(r) + ".match")),
                            replace = project->first(ProKey(replace_rules.at(r) + ".replace")),
                            filename = project->first(ProKey(replace_rules.at(r) + ".filename"));
            if (!match.isEmpty() /*&& match != replace*/
                && (filename.isEmpty() || filename == file_name)) {
                sedargs += " -e " + shellQuote("s," + match + "," + replace + ",g");
                if (isWindowsShell()
                    && project->first(ProKey(replace_rules.at(r) + ".CONFIG")).contains("path"))
                    sedargs += " -e "
                            + shellQuote("s," + windowsifyPath(match.toQString()) + ","
                                         + windowsifyPath(replace.toQString()) + ",gi");
            }
        }
    }
    return sedargs;
}